

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_accum_param(vector_t ***out,vector_t ***in,uint32 n_mgau,uint32 n_feat,uint32 n_density,
                       uint32 *veclen)

{
  uint local_40;
  uint local_3c;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_mgau_local;
  vector_t ***in_local;
  vector_t ***out_local;
  
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (local_3c = 0; local_3c < n_density; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
          out[k][l][local_3c][local_40] =
               in[k][l][local_3c][local_40] + out[k][l][local_3c][local_40];
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_accum_param(vector_t ***out,
		   vector_t ***in,
		   uint32 n_mgau,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen)
{
    uint32 i, j, k, l;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    out[i][j][k][l] += in[i][j][k][l];
		}
	    }
	}
    }
}